

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualMemory_unix.cpp
# Opt level: O2

void * xmrig::VirtualMemory::allocateExecutableMemory(size_t size)

{
  void *pvVar1;
  
  pvVar1 = mmap((void *)0x0,size,7,0x22,-1,0);
  if (pvVar1 == (void *)0xffffffffffffffff) {
    pvVar1 = (void *)0x0;
  }
  return pvVar1;
}

Assistant:

void *xmrig::VirtualMemory::allocateExecutableMemory(size_t size)
{
#   if defined(__APPLE__)
    void *mem = mmap(0, size, PROT_READ | PROT_WRITE | PROT_EXEC, MAP_PRIVATE | MAP_ANON, -1, 0);
#   else
    void *mem = mmap(0, size, PROT_READ | PROT_WRITE | PROT_EXEC, MAP_PRIVATE | MAP_ANONYMOUS, -1, 0);
#   endif

    return mem == MAP_FAILED ? nullptr : mem;
}